

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::~MoleculeStamp(MoleculeStamp *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__MoleculeStamp_0027b168;
  Utils::deletePointers<std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>>
            (&this->atomStamps_);
  Utils::deletePointers<std::vector<OpenMD::BondStamp*,std::allocator<OpenMD::BondStamp*>>>
            (&this->bondStamps_);
  Utils::deletePointers<std::vector<OpenMD::BendStamp*,std::allocator<OpenMD::BendStamp*>>>
            (&this->bendStamps_);
  Utils::deletePointers<std::vector<OpenMD::TorsionStamp*,std::allocator<OpenMD::TorsionStamp*>>>
            (&this->torsionStamps_);
  Utils::
  deletePointers<std::vector<OpenMD::InversionStamp*,std::allocator<OpenMD::InversionStamp*>>>
            (&this->inversionStamps_);
  Utils::
  deletePointers<std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>>
            (&this->rigidBodyStamps_);
  Utils::
  deletePointers<std::vector<OpenMD::CutoffGroupStamp*,std::allocator<OpenMD::CutoffGroupStamp*>>>
            (&this->cutoffGroupStamps_);
  Utils::deletePointers<std::vector<OpenMD::FragmentStamp*,std::allocator<OpenMD::FragmentStamp*>>>
            (&this->fragmentStamps_);
  Utils::
  deletePointers<std::vector<OpenMD::ConstraintStamp*,std::allocator<OpenMD::ConstraintStamp*>>>
            (&this->constraintStamps_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>::
  ~_Vector_base(&(this->constraintStamps_).
                 super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
               );
  std::_Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>::
  ~_Vector_base(&(this->fragmentStamps_).
                 super__Vector_base<OpenMD::FragmentStamp_*,_std::allocator<OpenMD::FragmentStamp_*>_>
               );
  std::_Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>::
  ~_Vector_base(&(this->cutoffGroupStamps_).
                 super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
               );
  std::_Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>::
  ~_Vector_base(&(this->rigidBodyStamps_).
                 super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
               );
  std::_Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::
  ~_Vector_base(&(this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
               );
  std::_Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>::~_Vector_base
            (&(this->torsionStamps_).
              super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>);
  std::_Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>::~_Vector_base
            (&(this->bendStamps_).
              super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>);
  std::_Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>::~_Vector_base
            (&(this->bondStamps_).
              super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::~_Vector_base
            (&(this->atomStamps_).
              super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>);
  ParameterBase::~ParameterBase(&(this->ConstrainTotalCharge).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->Name);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

MoleculeStamp::~MoleculeStamp() {
    Utils::deletePointers(atomStamps_);
    Utils::deletePointers(bondStamps_);
    Utils::deletePointers(bendStamps_);
    Utils::deletePointers(torsionStamps_);
    Utils::deletePointers(inversionStamps_);
    Utils::deletePointers(rigidBodyStamps_);
    Utils::deletePointers(cutoffGroupStamps_);
    Utils::deletePointers(fragmentStamps_);
    Utils::deletePointers(constraintStamps_);
  }